

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1185e52::QChildProcess::CharPointerList::updatePointers
          (CharPointerList *this,qsizetype count)

{
  const_iterator __i;
  type ppcVar1;
  long in_RSI;
  qsizetype i;
  char *base;
  const_iterator __i_00;
  unique_ptr<char_*[],_std::default_delete<char_*[]>_> *in_stack_ffffffffffffffd0;
  long local_20;
  
  __i = QByteArray::constBegin((QByteArray *)0x7a4851);
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    __i_00 = __i;
    ppcVar1 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                        (in_stack_ffffffffffffffd0,(size_t)__i);
    in_stack_ffffffffffffffd0 =
         (unique_ptr<char_*[],_std::default_delete<char_*[]>_> *)(__i_00 + (long)*ppcVar1);
    ppcVar1 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                        (in_stack_ffffffffffffffd0,(size_t)__i_00);
    *ppcVar1 = (char *)in_stack_ffffffffffffffd0;
  }
  return;
}

Assistant:

void QChildProcess::CharPointerList::updatePointers(qsizetype count)
{
    char *const base = const_cast<char *>(data.constBegin());
    for (qsizetype i = 0; i < count; ++i)
        pointers[i] = base + qptrdiff(pointers[i]);
}